

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTinySVD.cpp
# Opt level: O3

void verifyOrthonormal<float>(Matrix33<float> *A)

{
  float *pfVar1;
  int i;
  long lVar2;
  float *pfVar3;
  int j;
  long lVar4;
  float *pfVar5;
  int k;
  long lVar6;
  float fVar7;
  Matrix33<float> prod;
  float local_48 [12];
  float fStack_18;
  float local_14;
  float fStack_10;
  float fStack_c;
  float fStack_8;
  float local_4;
  
  pfVar1 = local_48;
  local_48[9] = A->x[0][0];
  local_48[10] = A->x[1][0];
  local_48[0xb] = A->x[2][0];
  fStack_18 = A->x[0][1];
  local_14 = A->x[1][1];
  fStack_10 = A->x[2][1];
  fStack_c = A->x[0][2];
  fStack_8 = A->x[1][2];
  local_4 = A->x[2][2];
  local_48[4] = 0.0;
  local_48[5] = 0.0;
  local_48[6] = 0.0;
  local_48[7] = 0.0;
  local_48[0] = 0.0;
  local_48[1] = 0.0;
  local_48[2] = 0.0;
  local_48[3] = 0.0;
  local_48[8] = 0.0;
  lVar2 = 0;
  do {
    lVar4 = 0;
    pfVar3 = local_48 + 9;
    do {
      fVar7 = local_48[lVar2 * 3 + lVar4];
      lVar6 = 0;
      pfVar5 = pfVar3;
      do {
        fVar7 = fVar7 + (*(float (*) [3])*(float (*) [3])A)[lVar6] * *pfVar5;
        lVar6 = lVar6 + 1;
        pfVar5 = pfVar5 + 3;
      } while (lVar6 != 3);
      local_48[lVar2 * 3 + lVar4] = fVar7;
      lVar4 = lVar4 + 1;
      pfVar3 = pfVar3 + 1;
    } while (lVar4 != 3);
    lVar2 = lVar2 + 1;
    A = (Matrix33<float> *)((long)A + 0xc);
  } while (lVar2 != 3);
  lVar2 = 0;
  do {
    lVar4 = 0;
    do {
      if (lVar2 == lVar4) {
        if (1.1920929e-05 <= ABS(local_48[lVar2 * 4] + -1.0)) {
          __assert_fail("std::abs (prod[i][j] - 1) < valueEps",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testTinySVD.cpp"
                        ,0x3a,"void verifyOrthonormal(const Imath_2_5::Matrix33<T> &) [T = float]");
        }
      }
      else if (1.1920929e-05 <= ABS(*(float *)((long)pfVar1 + lVar4 * 4))) {
        __assert_fail("std::abs (prod[i][j]) < valueEps",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testTinySVD.cpp"
                      ,0x3c,"void verifyOrthonormal(const Imath_2_5::Matrix33<T> &) [T = float]");
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    lVar2 = lVar2 + 1;
    pfVar1 = (float *)((long)pfVar1 + 0xc);
  } while (lVar2 != 3);
  return;
}

Assistant:

void
verifyOrthonormal (const IMATH_INTERNAL_NAMESPACE::Matrix33<T>& A)
{
    const T valueEps = T(100) * std::numeric_limits<T>::epsilon();

    const IMATH_INTERNAL_NAMESPACE::Matrix33<T> prod = A * A.transposed();
    for (int i = 0; i < 3; ++i)
    {
        for (int j = 0; j < 3; ++j)
        {
            if (i == j)
                assert (std::abs (prod[i][j] - 1) < valueEps);
            else
                assert (std::abs (prod[i][j]) < valueEps);
        }
    }
}